

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  value_type *pvVar1;
  const_iterator rollback;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_R8;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_b8;
  location local_68;
  
  rollback._M_current = (loc->iter_)._M_current;
  in_range<'\xee',_'\xef'>::invoke(&local_b8,loc);
  if (local_b8.is_ok_ == false) {
    location::reset(loc,rollback);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    pvVar1 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_b8);
    region::region((region *)&local_68,pvVar1);
    sequence<toml::detail::in_range<(char)-128,(char)-65>>::
    invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,(sequence<toml::detail::in_range<(char)_128,(char)_65>> *)loc,
               &local_68,(region *)rollback._M_current,in_R8);
    region::~region((region *)&local_68);
    rollback._M_current = (char *)loc;
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup
            (&local_b8,(EVP_PKEY_CTX *)rollback._M_current);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto first = loc.iter();
        auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        return sequence<Tail...>::invoke(loc, std::move(rslt.unwrap()), first);
    }